

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram.cc
# Opt level: O2

void __thiscall prometheus::Histogram::Reset(Histogram *this)

{
  pointer pCVar1;
  size_t i;
  ulong uVar2;
  long lVar3;
  
  std::mutex::lock(&this->mutex_);
  lVar3 = 0;
  for (uVar2 = 0;
      pCVar1 = (this->bucket_counts_).
               super__Vector_base<prometheus::Counter,_std::allocator<prometheus::Counter>_>._M_impl
               .super__Vector_impl_data._M_start,
      uVar2 < (ulong)((long)(this->bucket_counts_).
                            super__Vector_base<prometheus::Counter,_std::allocator<prometheus::Counter>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pCVar1 >> 3);
      uVar2 = uVar2 + 1) {
    Counter::Reset((Counter *)((long)&(pCVar1->gauge_).value_._M_i + lVar3));
    lVar3 = lVar3 + 8;
  }
  Gauge::Set(&this->sum_,0.0);
  pthread_mutex_unlock((pthread_mutex_t *)&this->mutex_);
  return;
}

Assistant:

void Histogram::Reset() {
  std::lock_guard<std::mutex> lock(mutex_);
  for (std::size_t i = 0; i < bucket_counts_.size(); ++i) {
    bucket_counts_[i].Reset();
  }
  sum_.Set(0);
}